

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

void __thiscall llvm::detail::IEEEFloat::IEEEFloat(IEEEFloat *this,fltSemantics *ourSemantics)

{
  integerPart *piVar1;
  uint uVar2;
  
  this->semantics = ourSemantics;
  uVar2 = ourSemantics->precision + 0x40;
  if (0x7f < uVar2) {
    piVar1 = (integerPart *)operator_new__((ulong)(uVar2 >> 3 & 0xfffffff8));
    (this->significand).parts = piVar1;
  }
  this->field_0x12 = this->field_0x12 & 0xf0 | 3;
  return;
}

Assistant:

IEEEFloat::IEEEFloat(const fltSemantics &ourSemantics) {
  initialize(&ourSemantics);
  category = fcZero;
  sign = false;
}